

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::TuplePrefixPrinter<2ul>::PrintPrefixTo<std::tuple<int,int>>
               (tuple<int,_int> *t,ostream *os)

{
  testing_internal::DefaultPrintNonContainerTo<int>
            (&(t->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>._M_head_impl,
             os);
  std::operator<<(os,", ");
  testing_internal::DefaultPrintNonContainerTo<int>((int *)t,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }